

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation>
          (SmallVectorBase<slang::SourceLocation> *this,SourceLocation *args)

{
  size_type sVar1;
  ulong uVar2;
  pointer pSVar3;
  SourceLocation *pSVar4;
  size_type sVar5;
  SourceLocation *pSVar6;
  SourceLocation *pSVar7;
  long lVar8;
  SourceLocation *pSVar9;
  long lVar10;
  ulong capacity;
  
  pSVar9 = this->data_ + this->len;
  if (this->len == this->cap) {
    if (this->len == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = this->len + 1;
    uVar2 = this->cap;
    if (capacity < uVar2 * 2) {
      capacity = uVar2 * 2;
    }
    if (0x7fffffffffffffff - uVar2 < uVar2) {
      capacity = 0x7fffffffffffffff;
    }
    lVar10 = (long)pSVar9 - (long)this->data_;
    pSVar6 = (SourceLocation *)detail::allocArray(capacity,8);
    *(SourceLocation *)((long)pSVar6 + lVar10) = *args;
    pSVar7 = this->data_;
    sVar1 = this->len;
    pSVar4 = pSVar6;
    if (pSVar7 + sVar1 == pSVar9) {
      if (sVar1 != 0) {
        lVar8 = 0;
        do {
          *(undefined8 *)((long)&pSVar6->field_0x0 + lVar8) =
               *(undefined8 *)((long)&pSVar7->field_0x0 + lVar8);
          lVar8 = lVar8 + 8;
        } while (sVar1 << 3 != lVar8);
      }
    }
    else {
      for (; pSVar7 != pSVar9; pSVar7 = pSVar7 + 1) {
        *pSVar4 = *pSVar7;
        pSVar4 = pSVar4 + 1;
      }
      sVar1 = this->len;
      pSVar3 = this->data_;
      if (pSVar3 + sVar1 != pSVar9) {
        pSVar7 = (SourceLocation *)((long)pSVar6 + lVar10);
        do {
          pSVar7 = pSVar7 + 1;
          *pSVar7 = *pSVar9;
          pSVar9 = pSVar9 + 1;
        } while (pSVar9 != pSVar3 + sVar1);
      }
    }
    if (this->data_ != (pointer)this->firstElement) {
      free(this->data_);
    }
    this->len = this->len + 1;
    this->cap = capacity;
    this->data_ = pSVar6;
    return (reference)((long)pSVar6 + lVar10);
  }
  *pSVar9 = *args;
  sVar1 = this->len;
  sVar5 = sVar1 + 1;
  this->len = sVar5;
  if (sVar5 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<slang::SourceLocation>::back() [T = slang::SourceLocation]"
              );
  }
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }